

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
::operator()(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  View<short,_false,_std::allocator<unsigned_long>_> *this_00;
  pointer psVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *this_01;
  pointer piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  runtime_error *this_02;
  
  this_00 = this->e1_;
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  psVar1 = this_00->data_;
  if ((psVar1 == (pointer)0x0) || ((this_00->geometry_).dimension_ != 3)) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Assertion failed.");
  }
  else {
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::strides(this_00,0);
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                      (this_00,3,c1,c2);
    this_01 = this->e2_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(this_01);
    piVar2 = this_01->data_;
    if ((piVar2 != (pointer)0x0) && ((this_01->geometry_).dimension_ == 3)) {
      sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(this_01,0);
      sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                        (this_01,3,c1,c2);
      return (int)psVar1[sVar3 * c0 + sVar4] - piVar2[sVar5 * c0 + sVar6];
    }
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Assertion failed.");
  }
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }